

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes ReadUi32s(CSzData *sd2,UInt32 numItems,CSzBitUi32s *crcs,ISzAlloc *alloc)

{
  Byte *pBVar1;
  UInt32 *pUVar2;
  UInt32 *pUVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (numItems == 0) {
    crcs->Vals = (UInt32 *)0x0;
  }
  else {
    pUVar3 = (UInt32 *)(*alloc->Alloc)(alloc,(ulong)numItems * 4);
    crcs->Vals = pUVar3;
    if (pUVar3 == (UInt32 *)0x0) {
      return 2;
    }
  }
  pUVar3 = (UInt32 *)sd2->Data;
  uVar4 = sd2->Size;
  if (numItems != 0) {
    pBVar1 = crcs->Defs;
    pUVar2 = crcs->Vals;
    uVar5 = 0;
    do {
      if ((char)(pBVar1[uVar5 >> 3 & 0x1fffffff] << ((byte)uVar5 & 7)) < '\0') {
        if (uVar4 < 4) {
          return 0x10;
        }
        pUVar2[uVar5] = *pUVar3;
        uVar4 = uVar4 - 4;
        pUVar3 = pUVar3 + 1;
      }
      else {
        pUVar2[uVar5] = 0;
      }
      uVar5 = uVar5 + 1;
    } while (numItems != uVar5);
  }
  sd2->Data = (Byte *)pUVar3;
  sd2->Size = uVar4;
  return 0;
}

Assistant:

static MY_NO_INLINE SRes ReadUi32s(CSzData *sd2, UInt32 numItems, CSzBitUi32s *crcs, ISzAlloc *alloc)
{
  UInt32 i;
  CSzData sd;
  UInt32 *vals;
  const Byte *defs;
  MY_ALLOC_ZE(UInt32, crcs->Vals, numItems, alloc);
  sd = *sd2;
  defs = crcs->Defs;
  vals = crcs->Vals;
  for (i = 0; i < numItems; i++)
    if (SzBitArray_Check(defs, i))
    {
      SZ_READ_32(vals[i]);
    }
    else
      vals[i] = 0;
  *sd2 = sd;
  return SZ_OK;
}